

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdUVTexture>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdUVTexture *texture,string *warn,string *err,PrimReconstructOptions *options)

{
  optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *this;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *result;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *result_00;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
  *result_01;
  _Rb_tree_node_base *__lhs;
  Property *prop;
  double t;
  uint uVar1;
  pointer pSVar2;
  bool bVar3;
  ostringstream oVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  __type _Var8;
  int iVar9;
  ostream *poVar10;
  value_type *pvVar11;
  _Base_ptr p_Var12;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar13;
  value_type *pvVar14;
  size_type sVar15;
  _Base_ptr p_Var16;
  mapped_type *this_00;
  Property *pPVar17;
  _Base_ptr p_Var18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  string *psVar22;
  key_type *name;
  PrimVar *this_01;
  _Rb_tree_node_base *p_Var23;
  TypedTerminalAttribute<std::array<float,_3UL>_> *in_stack_fffffffffffffad8;
  allocator local_4e2;
  allocator local_4e1;
  _Rb_tree_node_base *local_4e0;
  ParseResult ret;
  ParseResult ret_1;
  Animatable<tinyusdz::value::texcoord2f> animatable_value;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<tinyusdz::value::texcoord2f> pv;
  string attr_type_name;
  optional<tinyusdz::value::texcoord2f> pv_3;
  storage_t<tinyusdz::Token> local_390;
  PrimVar *local_370;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_368;
  string *local_360;
  TypedTerminalAttribute<float> *local_358;
  TypedTerminalAttribute<float> *local_350;
  TypedTerminalAttribute<float> *local_348;
  TypedTerminalAttribute<float> *local_340;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_338;
  _Base_ptr local_330;
  _Base_ptr local_328;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *local_320;
  string local_318;
  ostringstream ss_e;
  undefined4 uStack_2f4;
  undefined1 auStack_2f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [23];
  string local_170;
  undefined1 local_150 [32];
  function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_130;
  function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  string local_f0 [32];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&ss_e,"info:id",(allocator *)&ret);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  p_Var23 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_320 = &texture->file;
  local_338 = &(texture->st)._paths;
  this = &(texture->st)._attrib;
  local_340 = &texture->outputsR;
  local_348 = &texture->outputsG;
  local_350 = &texture->outputsB;
  local_358 = &texture->outputsA;
  local_360 = (string *)&texture->outputsRGB;
  local_368 = &(texture->super_ShaderNode).super_UsdShadePrim.props;
  result = &texture->wrapT;
  result_00 = &texture->wrapS;
  result_01 = &texture->sourceColorSpace;
  local_4e0 = p_Var23;
  for (p_Var16 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 != p_Var23; p_Var16 = (_Base_ptr)::std::_Rb_tree_increment(p_Var16)) {
    __lhs = p_Var16 + 1;
    ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
    prop = (Property *)(p_Var16 + 2);
    psVar22 = (string *)&ss_e;
    ::std::__cxx11::string::string((string *)psVar22,"inputs:file",(allocator *)&animatable_value);
    pPVar17 = prop;
    anon_unknown_0::ParseTypedAttribute<tinyusdz::value::AssetPath>
              (&ret,&table,&local_50,prop,psVar22,local_320);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar9 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      iVar9 = 3;
LAB_001cec5d:
      bVar7 = false;
    }
    else {
      bVar7 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xfed);
        ::std::operator<<(poVar10," ");
        ::std::__cxx11::string::string
                  ((string *)&ret_1,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)&attr_type_name);
        pPVar17 = (Property *)&ret.err;
        fmt::format<char[12],std::__cxx11::string>
                  ((string *)&animatable_value,(fmt *)&ret_1,(string *)"inputs:file",
                   (char (*) [12])pPVar17,psVar22);
        poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &animatable_value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ret_1,err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        iVar9 = 1;
        goto LAB_001cec5d;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar7) {
      ::std::__cxx11::string::string((string *)&local_170,(string *)__lhs);
      ::std::__cxx11::string::string((string *)&local_318,"inputs:st",&local_4e2);
      ret_1.err._M_dataplus._M_p = (pointer)&ret_1.err.field_2;
      ret_1.err._M_string_length = 0;
      ret_1.err.field_2._M_local_buf[0] = '\0';
      iVar9 = ::std::__cxx11::string::compare((string *)&local_170);
      if (iVar9 == 0) {
        if (((ulong)p_Var16[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          ret_1.code = PropertyTypeMismatch;
          ::std::__cxx11::string::string
                    ((string *)&ret,"Property {} must be Attribute, but declared as Relationhip.",
                     (allocator *)&animatable_value);
          fmt::format<std::__cxx11::string>
                    ((string *)&ss_e,(fmt *)&ret,&local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar17);
          ::std::__cxx11::string::operator=((string *)&ret_1.err,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
          _Var8 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ss_e,&attr_type_name);
          if (_Var8) {
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
            _Var8 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (!_Var8) {
              ret_1.code = TypeMismatch;
              ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
              poVar10 = ::std::operator<<((ostream *)local_2e8[0]._M_local_buf,
                                          "Property type mismatch. ");
              poVar10 = ::std::operator<<(poVar10,(string *)&local_318);
              poVar10 = ::std::operator<<(poVar10," expects type `");
              tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
              poVar10 = ::std::operator<<(poVar10,(string *)&ret);
              poVar10 = ::std::operator<<(poVar10,"` but defined as type `");
              poVar10 = ::std::operator<<(poVar10,(string *)&attr_type_name);
              ::std::operator<<(poVar10,"`");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&ret_1.err,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
              goto LAB_001cf658;
            }
          }
          local_328 = p_Var16[6]._M_parent;
          p_Var18 = p_Var16[6]._M_left;
          local_330 = p_Var18;
          if (p_Var18 != local_328) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_338,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var16[6]._M_parent);
          }
          iVar9 = *(int *)((long)&p_Var16[0x17]._M_parent + 4);
          if (iVar9 == 1) {
            bVar7 = Attribute::is_blocked((Attribute *)prop);
            if (bVar7) {
              (texture->st)._blocked = true;
            }
            else if (p_Var16[3]._M_color == _S_black) {
              bVar7 = primvar::PrimVar::is_timesamples((PrimVar *)&p_Var16[4]._M_parent);
              if (bVar7) {
                ret_1.code = VariabilityMismatch;
                ::std::__cxx11::string::string
                          ((string *)&ret,"TimeSample value is assigned to `uniform` property `{}",
                           (allocator *)&animatable_value);
                fmt::format<std::__cxx11::string>
                          ((string *)&ss_e,(fmt *)&ret,&local_318,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var18);
                ::std::__cxx11::string::operator=((string *)&ret_1.err,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                p_Var23 = local_4e0;
                goto LAB_001cf658;
              }
              Attribute::get_value<tinyusdz::value::texcoord2f>
                        ((optional<tinyusdz::value::texcoord2f> *)&ss_e,(Attribute *)prop);
              pv.has_value_ = (bool)ss_e;
              if (ss_e != (ostringstream)0x1) {
                ret_1.code = TypeMismatch;
                ::std::__cxx11::string::string
                          ((string *)&ret,
                           "Fallback. Failed to retrieve value with requested type `{}`.",
                           (allocator *)&local_390);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>
                          ((string *)&ss_e,(fmt *)&ret,(string *)&animatable_value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var18);
                ::std::__cxx11::string::operator=((string *)&ret_1.err,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                p_Var23 = local_4e0;
                goto LAB_001cf65d;
              }
              pv.contained._4_2_ = auStack_2f0._0_2_;
              pv.contained.data.__align = (anon_struct_4_0_00000001_for___align)uStack_2f4;
              pv.contained._6_2_ = auStack_2f0._2_2_;
              pvVar11 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::value(&pv);
              local_2e8[0]._M_allocated_capacity = (code *)0x0;
              local_2e8[0]._M_local_buf[8] = '\0';
              local_2e8[0]._9_7_ = 0;
              local_2e8[1]._0_1_ = 0;
              local_2e8[1]._1_8_ = 0;
              _ss_e = (*pvVar11).s;
              uStack_2f4 = (*pvVar11).t;
              auStack_2f0[0] = true;
              auStack_2f0[1] = false;
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::
              operator=((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *)this,
                        (Animatable<tinyusdz::value::texcoord2f> *)&ss_e);
              ::std::
              _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
              ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                               *)local_2e8);
            }
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            animatable_value._ts._17_8_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            animatable_value._has_value = false;
            animatable_value._blocked = false;
            animatable_value._value.s = 0.0;
            animatable_value._value.t = 0.0;
            this_01 = (PrimVar *)&p_Var16[4]._M_parent;
            if (p_Var16[5]._M_left == p_Var16[5]._M_parent) {
              bVar5 = false;
LAB_001cf48d:
              bVar7 = bVar5;
              bVar6 = primvar::PrimVar::has_value(this_01);
              if (bVar6) {
                primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                          ((optional<tinyusdz::value::texcoord2f> *)&ss_e,this_01);
                pv_3.has_value_ = (bool)ss_e;
                if (ss_e != (ostringstream)0x1) {
                  ret_1.code = InternalError;
                  ::std::__cxx11::string::string
                            ((string *)&ret,
                             "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                             ,&local_4e1);
                  tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
                  primvar::PrimVar::type_name_abi_cxx11_((string *)&local_390,this_01);
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)&ss_e,(fmt *)&ret,(string *)&pv,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_390,psVar22);
                  ::std::__cxx11::string::operator=((string *)&ret_1.err,(string *)&ss_e);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  bVar6 = false;
                  bVar3 = false;
                  bVar5 = true;
                  goto LAB_001cf5cd;
                }
                pv_3.contained._4_2_ = auStack_2f0._0_2_;
                pv_3.contained.data.__align = (anon_struct_4_0_00000001_for___align)uStack_2f4;
                pv_3.contained._6_2_ = auStack_2f0._2_2_;
                pvVar11 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::value(&pv_3)
                ;
                animatable_value._value = *pvVar11;
                animatable_value._has_value = true;
                animatable_value._blocked = false;
                bVar6 = true;
              }
              else {
                bVar6 = false;
              }
              if ((bVar7) || (bVar6)) {
                nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::
                operator=((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *)this,
                          &animatable_value);
              }
              bVar3 = true;
              bVar5 = false;
            }
            else {
              local_2e8[1]._0_1_ = 0;
              local_2e8[1]._1_8_ = 0;
              local_2e8[0]._M_allocated_capacity = (code *)0x0;
              local_2e8[0]._M_local_buf[8] = '\0';
              local_2e8[0]._9_7_ = 0;
              auStack_2f0[0] = false;
              auStack_2f0[1] = false;
              _ss_e = 0.0;
              uStack_2f4 = 0.0;
              bVar7 = primvar::PrimVar::is_valid(this_01);
              local_370 = this_01;
              if (bVar7) {
                bVar7 = primvar::PrimVar::has_value(this_01);
                if (bVar7) {
                  primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                            ((optional<tinyusdz::value::texcoord2f> *)&local_390,this_01);
                  pv.has_value_ = (bool)local_390._0_1_;
                  if (local_390._0_1_ != '\x01') goto LAB_001cf1a8;
                  pv.contained = (storage_t<tinyusdz::value::texcoord2f>)local_390._4_8_;
                  pvVar11 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::value(&pv)
                  ;
                  _ss_e = (*pvVar11).s;
                  uStack_2f4 = (*pvVar11).t;
                  auStack_2f0[0] = true;
                  auStack_2f0[1] = false;
                  p_Var18 = p_Var16[5]._M_parent;
                  p_Var12 = p_Var16[5]._M_left;
                  if (p_Var12 != p_Var18) goto LAB_001cf1cb;
                }
                else {
LAB_001cf1a8:
                  p_Var18 = p_Var16[5]._M_parent;
                  p_Var12 = p_Var16[5]._M_left;
                  if (p_Var12 == p_Var18) {
                    ret.code = ret.code & 0xffffff00;
                    ret.err.field_2._M_allocated_capacity = 0;
                    ret.err.field_2._8_8_ = 0;
                    ret.err._M_dataplus._M_p = (pointer)0x0;
                    ret.err._M_string_length = 0;
                    goto LAB_001cf394;
                  }
LAB_001cf1cb:
                  lVar19 = 0;
                  for (uVar20 = 0; uVar20 < (ulong)(((long)p_Var12 - (long)p_Var18) / 0x28);
                      uVar20 = uVar20 + 1) {
                    pvVar13 = tinyusdz::value::TimeSamples::get_samples
                                        ((TimeSamples *)&p_Var16[5]._M_parent);
                    pSVar2 = (pvVar13->
                             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if ((&pSVar2->blocked)[lVar19] == true) {
                      TypedTimeSamples<tinyusdz::value::texcoord2f>::add_blocked_sample
                                ((TypedTimeSamples<tinyusdz::value::texcoord2f> *)local_2e8,
                                 *(double *)((long)&pSVar2->t + lVar19));
                    }
                    else {
                      tinyusdz::value::Value::get_value<tinyusdz::value::texcoord2f>
                                ((optional<tinyusdz::value::texcoord2f> *)&local_390,
                                 (Value *)((long)&(pSVar2->value).v_.storage + lVar19),false);
                      pv.has_value_ = (bool)local_390._0_1_;
                      if (local_390._0_1_ != '\x01') {
                        ret.code = ret.code & 0xffffff00;
                        ret.err.field_2._M_allocated_capacity = 0;
                        ret.err.field_2._8_8_ = 0;
                        ret.err._M_dataplus._M_p = (pointer)0x0;
                        ret.err._M_string_length = 0;
                        goto LAB_001cf394;
                      }
                      pv.contained = (storage_t<tinyusdz::value::texcoord2f>)local_390._4_8_;
                      t = *(double *)((long)&pSVar2->t + lVar19);
                      pvVar11 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::value
                                          (&pv);
                      TypedTimeSamples<tinyusdz::value::texcoord2f>::add_sample
                                ((TypedTimeSamples<tinyusdz::value::texcoord2f> *)local_2e8,t,
                                 pvVar11);
                    }
                    p_Var18 = p_Var16[5]._M_parent;
                    p_Var12 = p_Var16[5]._M_left;
                    lVar19 = lVar19 + 0x28;
                  }
                }
                nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_>
                ::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>,_0>
                          ((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)&ret,
                           (Animatable<tinyusdz::value::texcoord2f> *)&ss_e);
              }
              else {
                ret.code = ret.code & 0xffffff00;
                ret.err.field_2._M_allocated_capacity = 0;
                ret.err.field_2._8_8_ = 0;
                ret.err._M_dataplus._M_p = (pointer)0x0;
                ret.err._M_string_length = 0;
              }
LAB_001cf394:
              ::std::
              _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
              ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                               *)local_2e8);
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_>::
              optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>,_0>
                        ((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)&ss_e,
                         (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)&ret);
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_>::
              ~optional((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)&ret);
              oVar4 = ss_e;
              if (ss_e == (ostringstream)0x1) {
                pvVar14 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_>::value
                                    ((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *
                                     )&ss_e);
                Animatable<tinyusdz::value::texcoord2f>::operator=(&animatable_value,pvVar14);
              }
              else {
                ret_1.code = InternalError;
                ::std::__cxx11::string::string
                          ((string *)&pv,
                           "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                           ,(allocator *)&pv_3);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          ((string *)&ret,(fmt *)&pv,&local_170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_390,psVar22);
                ::std::__cxx11::string::operator=((string *)&ret_1.err,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_>::
              ~optional((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)&ss_e);
              bVar5 = true;
              bVar6 = false;
              bVar7 = false;
              bVar3 = false;
              this_01 = local_370;
              if (oVar4 != (ostringstream)0x0) goto LAB_001cf48d;
            }
LAB_001cf5cd:
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                             *)&animatable_value._ts);
            p_Var23 = local_4e0;
            if (!bVar3) {
              ::std::__cxx11::string::_M_dispose();
              if (bVar5) goto LAB_001cf65d;
              goto LAB_001cf658;
            }
LAB_001cf5f7:
            if (local_330 == local_328) {
              if ((!bVar7) && (!bVar6)) {
                ::std::__cxx11::string::assign((char *)&ret_1.err);
                ret_1.code = InternalError;
                goto LAB_001cf658;
              }
            }
            else if ((!bVar7) && (!bVar6)) goto LAB_001cee1c;
          }
          else {
            if (iVar9 != 0) {
              bVar6 = false;
              bVar7 = false;
              goto LAB_001cf5f7;
            }
LAB_001cee1c:
            (texture->st)._empty = true;
          }
          AttrMetas::operator=(&(texture->st)._metas,(AttrMetas *)(p_Var16 + 7));
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318
                    );
          ret_1.code = Success;
        }
LAB_001cf658:
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ret_1.code = Unmatched;
      }
LAB_001cf65d:
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar9 = 0;
      if ((ret_1.code & ~AlreadyProcessed) == Success) {
        bVar7 = false;
        iVar9 = 3;
      }
      else {
        bVar7 = true;
        if (ret_1.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xfef);
          ::std::operator<<(poVar10," ");
          ::std::__cxx11::string::string
                    ((string *)&animatable_value,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[10],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&animatable_value,(string *)0x48e5b5,
                     (char (*) [10])&ret_1.err,psVar22);
          poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&animatable_value,err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar7 = false;
          iVar9 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar7) goto LAB_001d047c;
      bVar7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"inputs:sourceColorSpace");
      if (bVar7) {
        ::std::__cxx11::string::string((string *)&ss_e,"inputs:sourceColorSpace",(allocator *)&ret);
        sVar15 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        p_Var23 = local_4e0;
        if (sVar15 == 0) {
          Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var8 = ::std::operator==((string *)&ss_e,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ret);
          if ((_Var8) && (uVar1 = *(uint *)((long)&p_Var16[0x17]._M_parent + 4), uVar1 < 2)) {
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (uVar1 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xff2);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
              poVar10 = ::std::operator<<(poVar10,"inputs:sourceColorSpace");
              poVar10 = ::std::operator<<(poVar10,"` token attribute. Set default token value.");
              ::std::operator<<(poVar10,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&animatable_value,err);
                ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              AttrMetas::operator=(&result_01->_metas,(AttrMetas *)(p_Var16 + 7));
              pcVar21 = "inputs:sourceColorSpace";
LAB_001cfd95:
              ::std::__cxx11::string::string((string *)&ss_e,pcVar21,(allocator *)&ret);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e)
              ;
              ::std::__cxx11::string::_M_dispose();
              goto LAB_001d0489;
            }
          }
          else {
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          _ss_e = 0.0;
          local_2e8[0]._M_local_buf[8] = '(';
          local_2e8[0]._9_7_ = 0x1e32;
          local_2e8[0]._M_allocated_capacity =
               ::std::
               _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4044:34)>
               ::_M_manager;
          ::std::__cxx11::string::string
                    ((string *)&ret,"inputs:sourceColorSpace",(allocator *)&animatable_value);
          bVar7 = options->strict_allowedToken_check;
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function(&local_110,
                     (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&ss_e);
          in_stack_fffffffffffffad8 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
          bVar7 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::SourceColorSpace,tinyusdz::UsdUVTexture::SourceColorSpace>
                            ((string *)&ret,bVar7,&local_110,(Attribute *)prop,result_01,warn,err);
          if (local_110.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_110.super__Function_base._M_manager)(&local_110,&local_110,3);
          }
          ::std::__cxx11::string::_M_dispose();
          iVar9 = 1;
          if (bVar7) {
            AttrMetas::operator=(&result_01->_metas,(AttrMetas *)(p_Var16 + 7));
            pcVar21 = "inputs:sourceColorSpace";
LAB_001d0437:
            ::std::__cxx11::string::string((string *)&ret,pcVar21,(allocator *)&animatable_value);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
            ::std::__cxx11::string::_M_dispose();
            iVar9 = 3;
          }
LAB_001d045f:
          auStack_2f0._2_2_ = 0;
          auStack_2f0[0] = false;
          auStack_2f0[1] = false;
          uStack_2f4 = 0.0;
          if ((code *)local_2e8[0]._0_8_ != (code *)0x0) {
            (*(code *)local_2e8[0]._0_8_)(&ss_e,&ss_e,3);
          }
          goto LAB_001d047c;
        }
      }
      else {
        bVar7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"inputs:wrapS");
        name = (key_type *)&ss_e;
        if (bVar7) {
          ::std::__cxx11::string::string((string *)name,"inputs:wrapS",(allocator *)&ret);
          sVar15 = ::std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(&table,name);
          ::std::__cxx11::string::_M_dispose();
          p_Var23 = local_4e0;
          if (sVar15 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var8 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var8) && (uVar1 = *(uint *)((long)&p_Var16[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xff5);
                ::std::operator<<(poVar10," ");
                poVar10 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar10 = ::std::operator<<(poVar10,"inputs:wrapS");
                poVar10 = ::std::operator<<(poVar10,"` token attribute. Set default token value.");
                ::std::operator<<(poVar10,"\n");
                if (warn != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&animatable_value,err);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&result_00->_metas,(AttrMetas *)(p_Var16 + 7));
                pcVar21 = "inputs:wrapS";
                goto LAB_001cfd95;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = 0.0;
            local_2e8[0]._M_local_buf[8] = '<';
            local_2e8[0]._9_7_ = 0x1e37;
            local_2e8[0]._M_allocated_capacity =
                 ::std::
                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4057:22)>
                 ::_M_manager;
            ::std::__cxx11::string::string
                      ((string *)&ret,"inputs:wrapS",(allocator *)&animatable_value);
            bVar7 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function(&local_130,
                       (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            in_stack_fffffffffffffad8 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
            bVar7 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                              ((string *)&ret,bVar7,&local_130,(Attribute *)prop,result_00,warn,err)
            ;
            if (local_130.super__Function_base._M_manager != (_Manager_type)0x0) {
              (*local_130.super__Function_base._M_manager)(&local_130,&local_130,3);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar9 = 1;
            if (bVar7) {
              AttrMetas::operator=(&result_00->_metas,(AttrMetas *)(p_Var16 + 7));
              pcVar21 = "inputs:wrapS";
              goto LAB_001d0437;
            }
            goto LAB_001d045f;
          }
        }
        else {
          bVar7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"inputs:wrapT");
          if (!bVar7) {
            ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
            ::std::__cxx11::string::string
                      ((string *)name,"outputs:r",(allocator *)&animatable_value);
            anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                      (&ret,&table,&local_70,prop,name,local_340);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar9 = 0;
            if ((ret.code & ~AlreadyProcessed) == Success) {
              bVar7 = false;
              iVar9 = 3;
            }
            else {
              bVar7 = true;
              if (ret.code != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xffa);
                ::std::operator<<(poVar10," ");
                ::std::__cxx11::string::string
                          ((string *)&ret_1,"Parsing shader output property `{}` failed. Error: {}",
                           (allocator *)&attr_type_name);
                fmt::format<char[10],std::__cxx11::string>
                          ((string *)&animatable_value,(fmt *)&ret_1,(string *)"outputs:r",
                           (char (*) [10])&ret.err,name);
                poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
                ::std::operator<<(poVar10,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&animatable_value,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret_1,err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                bVar7 = false;
                iVar9 = 1;
              }
            }
            ::std::__cxx11::string::_M_dispose();
            if (bVar7) {
              ::std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
              psVar22 = (string *)&ss_e;
              ::std::__cxx11::string::string
                        ((string *)psVar22,"outputs:g",(allocator *)&animatable_value);
              anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                        (&ret,&table,&local_90,prop,psVar22,local_348);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              iVar9 = 0;
              if ((ret.code & ~AlreadyProcessed) == Success) {
                bVar7 = false;
                iVar9 = 3;
              }
              else {
                bVar7 = true;
                if (ret.code != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar10 = ::std::operator<<(poVar10,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             );
                  poVar10 = ::std::operator<<(poVar10,":");
                  poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                  poVar10 = ::std::operator<<(poVar10,"():");
                  poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xffc);
                  ::std::operator<<(poVar10," ");
                  ::std::__cxx11::string::string
                            ((string *)&ret_1,
                             "Parsing shader output property `{}` failed. Error: {}",
                             (allocator *)&attr_type_name);
                  fmt::format<char[10],std::__cxx11::string>
                            ((string *)&animatable_value,(fmt *)&ret_1,(string *)"outputs:g",
                             (char (*) [10])&ret.err,psVar22);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
                  ::std::operator<<(poVar10,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&animatable_value,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret_1,err);
                    ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  bVar7 = false;
                  iVar9 = 1;
                }
              }
              ::std::__cxx11::string::_M_dispose();
              if (bVar7) {
                ::std::__cxx11::string::string((string *)&local_b0,(string *)__lhs);
                psVar22 = (string *)&ss_e;
                ::std::__cxx11::string::string
                          ((string *)psVar22,"outputs:b",(allocator *)&animatable_value);
                anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                          (&ret,&table,&local_b0,prop,psVar22,local_350);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                iVar9 = 0;
                if ((ret.code & ~AlreadyProcessed) == Success) {
                  bVar7 = false;
                  iVar9 = 3;
                }
                else {
                  bVar7 = true;
                  if (ret.code != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xffe);
                    ::std::operator<<(poVar10," ");
                    ::std::__cxx11::string::string
                              ((string *)&ret_1,
                               "Parsing shader output property `{}` failed. Error: {}",
                               (allocator *)&attr_type_name);
                    fmt::format<char[10],std::__cxx11::string>
                              ((string *)&animatable_value,(fmt *)&ret_1,(string *)"outputs:b",
                               (char (*) [10])&ret.err,psVar22);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
                    ::std::operator<<(poVar10,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&animatable_value,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&ret_1,err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    bVar7 = false;
                    iVar9 = 1;
                  }
                }
                ::std::__cxx11::string::_M_dispose();
                if (bVar7) {
                  ::std::__cxx11::string::string((string *)&local_d0,(string *)__lhs);
                  psVar22 = (string *)&ss_e;
                  ::std::__cxx11::string::string
                            ((string *)psVar22,"outputs:a",(allocator *)&animatable_value);
                  anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                            (&ret,&table,&local_d0,prop,psVar22,local_358);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  iVar9 = 0;
                  if ((ret.code & ~AlreadyProcessed) == Success) {
                    bVar7 = false;
                    iVar9 = 3;
                  }
                  else {
                    bVar7 = true;
                    if (ret.code != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1000);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&ret_1,
                                 "Parsing shader output property `{}` failed. Error: {}",
                                 (allocator *)&attr_type_name);
                      fmt::format<char[10],std::__cxx11::string>
                                ((string *)&animatable_value,(fmt *)&ret_1,(string *)"outputs:a",
                                 (char (*) [10])&ret.err,psVar22);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      if (err != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&animatable_value,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&ret_1,err);
                        ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value)
                        ;
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      bVar7 = false;
                      iVar9 = 1;
                    }
                  }
                  ::std::__cxx11::string::_M_dispose();
                  if (bVar7) {
                    ::std::__cxx11::string::string(local_f0,(string *)__lhs);
                    pPVar17 = (Property *)&ss_e;
                    ::std::__cxx11::string::string
                              ((string *)pPVar17,"outputs:rgb",(allocator *)&animatable_value);
                    (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,3ul>>
                              (&ret,(_anonymous_namespace_ *)&table,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_f0,(string *)prop,pPVar17,local_360,
                               in_stack_fffffffffffffad8);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    iVar9 = 0;
                    if ((ret.code & ~AlreadyProcessed) == Success) {
                      bVar7 = false;
                      iVar9 = 3;
                    }
                    else {
                      bVar7 = true;
                      if (ret.code != Unmatched) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar10 = ::std::operator<<(poVar10,":");
                        poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                        poVar10 = ::std::operator<<(poVar10,"():");
                        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1002);
                        ::std::operator<<(poVar10," ");
                        ::std::__cxx11::string::string
                                  ((string *)&ret_1,
                                   "Parsing shader output property `{}` failed. Error: {}",
                                   (allocator *)&attr_type_name);
                        fmt::format<char[12],std::__cxx11::string>
                                  ((string *)&animatable_value,(fmt *)&ret_1,(string *)"outputs:rgb"
                                   ,(char (*) [12])&ret.err,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar17);
                        poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
                        ::std::operator<<(poVar10,"\n");
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        if (err != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&animatable_value,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&ret_1,err);
                          ::std::__cxx11::string::operator=
                                    ((string *)err,(string *)&animatable_value);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        bVar7 = false;
                        iVar9 = 1;
                      }
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (bVar7) {
                      sVar15 = ::std::
                               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::count(&table,(key_type *)__lhs);
                      if (sVar15 == 0) {
                        this_00 = ::std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                  ::operator[](local_368,(key_type *)__lhs);
                        Property::operator=(this_00,prop);
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)&table,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__lhs);
                      }
                      sVar15 = ::std::
                               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::count(&table,(key_type *)__lhs);
                      if (sVar15 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                        poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar10 = ::std::operator<<(poVar10,":");
                        poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                        poVar10 = ::std::operator<<(poVar10,"():");
                        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1004);
                        ::std::operator<<(poVar10," ");
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&ret,"Unsupported/unimplemented property: ",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)__lhs);
                        poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
                        ::std::operator<<(poVar10,"\n");
                        ::std::__cxx11::string::_M_dispose();
                        if (warn != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&ret,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&animatable_value,err);
                          ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      }
                      goto LAB_001d0489;
                    }
                  }
                }
              }
            }
            goto LAB_001d047c;
          }
          ::std::__cxx11::string::string((string *)name,"inputs:wrapT",(allocator *)&ret);
          sVar15 = ::std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(&table,name);
          ::std::__cxx11::string::_M_dispose();
          p_Var23 = local_4e0;
          if (sVar15 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var8 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var8) && (uVar1 = *(uint *)((long)&p_Var16[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xff8);
                ::std::operator<<(poVar10," ");
                poVar10 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar10 = ::std::operator<<(poVar10,"inputs:wrapT");
                poVar10 = ::std::operator<<(poVar10,"` token attribute. Set default token value.");
                ::std::operator<<(poVar10,"\n");
                if (warn != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&animatable_value,err);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var16 + 7));
                pcVar21 = "inputs:wrapT";
                goto LAB_001cfd95;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = 0.0;
            local_2e8[0]._M_local_buf[8] = '<';
            local_2e8[0]._9_7_ = 0x1e37;
            local_2e8[0]._M_allocated_capacity =
                 ::std::
                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4057:22)>
                 ::_M_manager;
            ::std::__cxx11::string::string
                      ((string *)&ret,"inputs:wrapT",(allocator *)&animatable_value);
            bVar7 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_150,
                       (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            in_stack_fffffffffffffad8 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
            bVar7 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                              ((string *)&ret,bVar7,
                               (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)local_150,(Attribute *)prop,result,warn,err);
            if ((anon_struct_8_0_00000001_for___align)local_150._16_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              (*(code *)local_150._16_8_)
                        ((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_150,
                         (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_150,3);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar9 = 1;
            if (bVar7) {
              AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var16 + 7));
              pcVar21 = "inputs:wrapT";
              goto LAB_001d0437;
            }
            goto LAB_001d045f;
          }
        }
      }
    }
    else {
LAB_001d047c:
      if ((iVar9 != 3) && (iVar9 != 0)) break;
    }
LAB_001d0489:
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return p_Var16 == p_Var23;
}

Assistant:

bool ReconstructShader<UsdUVTexture>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdUVTexture *texture,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;

  auto SourceColorSpaceHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::SourceColorSpace, std::string> {
    using EnumTy = std::pair<UsdUVTexture::SourceColorSpace, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::SourceColorSpace::Auto, "auto"),
        std::make_pair(UsdUVTexture::SourceColorSpace::Raw, "raw"),
        std::make_pair(UsdUVTexture::SourceColorSpace::SRGB, "sRGB"),
    };

    return EnumHandler<UsdUVTexture::SourceColorSpace>(
        "inputs:sourceColorSpace", tok, enums);
  };

  auto WrapHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::Wrap, std::string> {
    using EnumTy = std::pair<UsdUVTexture::Wrap, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::Wrap::UseMetadata, "useMetadata"),
        std::make_pair(UsdUVTexture::Wrap::Black, "black"),
        std::make_pair(UsdUVTexture::Wrap::Clamp, "clamp"),
        std::make_pair(UsdUVTexture::Wrap::Repeat, "repeat"),
        std::make_pair(UsdUVTexture::Wrap::Mirror, "mirror"),
    };

    return EnumHandler<UsdUVTexture::Wrap>(
        "inputs:wrap*", tok, enums);
  };

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    DCOUT("prop.name = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:file", UsdUVTexture, texture->file)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:st", UsdUVTexture,
                          texture->st)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:sourceColorSpace",
                       UsdUVTexture::SourceColorSpace, SourceColorSpaceHandler, UsdUVTexture,
                       texture->sourceColorSpace, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapS",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapS, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapT",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapT, options.strict_allowedToken_check)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:r", UsdUVTexture,
                                  texture->outputsR)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:g", UsdUVTexture,
                                  texture->outputsG)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:b", UsdUVTexture,
                                  texture->outputsB)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:a", UsdUVTexture,
                                  texture->outputsA)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:rgb", UsdUVTexture,
                                  texture->outputsRGB)
    ADD_PROPERTY(table, prop, UsdUVTexture, texture->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("UsdUVTexture reconstructed.");
  return true;
}